

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_get_file_info(fdb_file_handle *fhandle,fdb_file_info *info)

{
  ulong uVar1;
  fdb_kvs_handle *handle;
  kvs_header *pkVar2;
  filemgr *pfVar3;
  size_t sVar4;
  size_t sVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  fdb_status fVar8;
  
  if (fhandle == (fdb_file_handle *)0x0) {
    fVar8 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (info == (fdb_file_info *)0x0) {
    fVar8 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    handle = fhandle->root;
    fdb_check_file_reopen(handle,(file_status_t *)0x0);
    fdb_sync_db_header(handle);
    if ((handle->config).compaction_mode == '\x01') {
      pfVar3 = (filemgr *)&handle->filename;
    }
    else {
      pfVar3 = handle->file;
    }
    info->filename = pfVar3->filename;
    if (handle->shandle == (snap_handle *)0x0) {
      info->new_filename = (char *)0x0;
    }
    sVar4 = wal_get_num_docs(handle->file);
    sVar5 = wal_get_num_deletes(handle->file);
    uVar6 = _kvs_stat_get_sum(handle->file,KVS_STAT_NDOCS);
    uVar1 = uVar6 + (sVar4 - sVar5);
    uVar7 = uVar1 - sVar5;
    if (uVar6 == 0) {
      uVar7 = sVar4 - sVar5;
    }
    fVar8 = FDB_RESULT_SUCCESS;
    uVar6 = 0;
    if (sVar5 <= uVar1) {
      uVar6 = uVar7;
    }
    info->doc_count = uVar6;
    uVar7 = _kvs_stat_get_sum(handle->file,KVS_STAT_NDELETES);
    info->deleted_count = uVar7 + sVar5;
    sVar4 = fdb_estimate_space_used(fhandle);
    info->space_used = sVar4;
    info->file_size = (handle->file->pos).super___atomic_base<unsigned_long>._M_i;
    uVar7 = _kvs_stat_get_sum(handle->file,KVS_STAT_NLIVENODES);
    info->num_live_nodes = uVar7;
    pfVar3 = handle->file;
    pkVar2 = pfVar3->kv_header;
    if (pkVar2 == (kvs_header *)0x0) {
      uVar7 = 1;
    }
    else {
      pthread_spin_lock(&pkVar2->lock);
      uVar7 = pkVar2->num_kv_stores + 1;
      pthread_spin_unlock(&pkVar2->lock);
      pfVar3 = handle->file;
    }
    info->num_kv_stores = uVar7;
    uVar7 = sb_get_bmp_revnum(pfVar3);
    info->sb_bmp_revnum = uVar7;
  }
  return fVar8;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_file_info(fdb_file_handle *fhandle, fdb_file_info *info)
{
    uint64_t ndocs, ndeletes;
    fdb_kvs_handle *handle;

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!info) {
        return FDB_RESULT_INVALID_ARGS;
    }
    handle = fhandle->root;

    fdb_check_file_reopen(handle, NULL);
    fdb_sync_db_header(handle);

    if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
        // compaction daemon mode
        info->filename = handle->filename;
    } else {
        info->filename = handle->file->filename;
    }

    if (handle->shandle) {
        // handle for snapshot
    } else {
        info->new_filename = NULL;
    }

    // Note that doc_count includes the number of WAL entries, which might
    // incur an incorrect estimation. However, after the WAL flush, the doc
    // counter becomes consistent. We plan to devise a new way of tracking
    // the number of docs in a database instance.
    size_t wal_docs = wal_get_num_docs(handle->file);
    size_t wal_deletes = wal_get_num_deletes(handle->file);
    size_t wal_n_inserts = wal_docs - wal_deletes;

    ndocs = _kvs_stat_get_sum(handle->file, KVS_STAT_NDOCS);

    if (ndocs + wal_n_inserts < wal_deletes) {
        info->doc_count = 0;
    } else {
        if (ndocs) {
            info->doc_count = ndocs + wal_n_inserts - wal_deletes;
        } else {
            info->doc_count = wal_n_inserts;
        }
    }

    ndeletes = _kvs_stat_get_sum(handle->file, KVS_STAT_NDELETES);
    if (ndeletes) { // not accurate since some ndeletes may be wal_deletes
        info->deleted_count = ndeletes + wal_deletes;
    } else { // this is accurate since it reflects only wal_ndeletes
        info->deleted_count = wal_deletes;
    }

    info->space_used = fdb_estimate_space_used(fhandle);
    info->file_size = filemgr_get_pos(handle->file);
    info->num_live_nodes = _kvs_stat_get_sum(handle->file, KVS_STAT_NLIVENODES);

    // Get the number of KV store instances in a given ForestDB file.
    struct kvs_header *kv_header = handle->file->kv_header;
    size_t num = 1; // default KV store.
    if (kv_header) {
        spin_lock(&kv_header->lock);
        num += kv_header->num_kv_stores;
        spin_unlock(&kv_header->lock);
    }
    info->num_kv_stores = num;

    info->sb_bmp_revnum = sb_get_bmp_revnum(handle->file);

    return FDB_RESULT_SUCCESS;
}